

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decPrint.c
# Opt level: O1

void Dec_GraphPrint_rec(FILE *pFile,Dec_Graph_t *pGraph,Dec_Node_t *pNode,int fCompl,char **pNamesIn
                       ,int *pPos,int LitSizeMax)

{
  Dec_Node_t *pNode_00;
  Dec_Node_t *pDVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  Dec_Edge_t DVar5;
  uint uVar6;
  Dec_Node_t *pNode_01;
  int iLeaf;
  uint uVar7;
  uint uVar8;
  int in_stack_ffffffffffffffb8;
  
  pDVar1 = pGraph->pNodes;
  iVar3 = (int)((ulong)((long)pNode - (long)pDVar1) >> 3);
  iLeaf = iVar3 * -0x55555555;
  iVar2 = pGraph->nLeaves;
  if (iVar2 != iLeaf && SBORROW4(iVar2,iLeaf) == iVar2 + iVar3 * 0x55555555 < 0) {
    iVar2 = Dec_GraphPrintGetLeafName(pFile,iLeaf,fCompl,pNamesIn);
    goto LAB_005c4de9;
  }
  uVar7 = (uint)pNode->eEdge0 >> 1 & 0x3fffffff;
  pNode_00 = pDVar1 + uVar7;
  uVar6 = (uint)pNode->eEdge1 >> 1 & 0x3fffffff;
  pNode_01 = pDVar1 + uVar6;
  if (((int)uVar7 < iVar2) || ((int)uVar6 < iVar2)) {
LAB_005c4d42:
    fputc(0x28,(FILE *)pFile);
    *pPos = *pPos + 1;
    uVar6 = (uint)pNode->eEdge0 & 1;
    if (fCompl == 0) {
      Dec_GraphPrint_rec(pFile,pGraph,pNode_00,uVar6,pNamesIn,pPos,in_stack_ffffffffffffffb8);
      DVar5 = pNode->eEdge1;
    }
    else {
      Dec_GraphPrint_rec(pFile,pGraph,pNode_00,uVar6 ^ 1,pNamesIn,pPos,in_stack_ffffffffffffffb8);
      fwrite(" + ",3,1,(FILE *)pFile);
      *pPos = *pPos + 3;
      DVar5 = (Dec_Edge_t)~(uint)pNode->eEdge1;
    }
  }
  else {
    uVar6 = (uint)pNode_00->eEdge0 >> 1 & 0x3fffffff;
    uVar8 = (uint)pNode_01->eEdge0 >> 1 & 0x3fffffff;
    uVar7 = (uint)pNode_01->eEdge1 >> 1 & 0x3fffffff;
    if ((uVar6 != uVar8) && (uVar6 != uVar7)) goto LAB_005c4d42;
    uVar4 = (uint)pNode_00->eEdge1 >> 1 & 0x3fffffff;
    if ((uVar4 != uVar8) && (uVar4 != uVar7)) goto LAB_005c4d42;
    pNode_01 = pDVar1 + uVar4;
    fputc(0x28,(FILE *)pFile);
    *pPos = *pPos + 1;
    Dec_GraphPrint_rec(pFile,pGraph,pDVar1 + uVar6,*(uint *)&pDVar1[uVar6].field_0x10 >> 0xf & 1,
                       pNamesIn,pPos,in_stack_ffffffffffffffb8);
    fwrite(" # ",3,1,(FILE *)pFile);
    *pPos = *pPos + 3;
    DVar5 = (Dec_Edge_t)(*(uint *)&pNode_01->field_0x10 >> 0x10);
  }
  Dec_GraphPrint_rec(pFile,pGraph,pNode_01,(uint)DVar5 & 1,pNamesIn,pPos,in_stack_ffffffffffffffb8);
  fputc(0x29,(FILE *)pFile);
  iVar2 = 1;
LAB_005c4de9:
  *pPos = *pPos + iVar2;
  return;
}

Assistant:

void Dec_GraphPrint_rec( FILE * pFile, Dec_Graph_t * pGraph, Dec_Node_t * pNode, int fCompl, char * pNamesIn[], int * pPos, int LitSizeMax )
{
    Dec_Node_t * pNode0, * pNode1;
    Dec_Node_t * pNode00, * pNode01, * pNode10, * pNode11;
    pNode0 = Dec_GraphNode(pGraph, pNode->eEdge0.Node);
    pNode1 = Dec_GraphNode(pGraph, pNode->eEdge1.Node);
    if ( Dec_GraphNodeIsVar(pGraph, pNode) ) // FT_NODE_LEAF )
    {
        (*pPos) += Dec_GraphPrintGetLeafName( pFile, Dec_GraphNodeInt(pGraph,pNode), fCompl, pNamesIn );
        return;
    }
    if ( !Dec_GraphNodeIsVar(pGraph, pNode0) && !Dec_GraphNodeIsVar(pGraph, pNode1) )
    {
        pNode00 = Dec_GraphNode(pGraph, pNode0->eEdge0.Node);
        pNode01 = Dec_GraphNode(pGraph, pNode0->eEdge1.Node);
        pNode10 = Dec_GraphNode(pGraph, pNode1->eEdge0.Node);
        pNode11 = Dec_GraphNode(pGraph, pNode1->eEdge1.Node);
        if ( (pNode00 == pNode10 || pNode00 == pNode11) && (pNode01 == pNode10 || pNode01 == pNode11) )
        {
            fprintf( pFile, "(" );
            (*pPos)++;
            Dec_GraphPrint_rec( pFile, pGraph, pNode00, pNode00->fCompl0, pNamesIn, pPos, LitSizeMax );
            fprintf( pFile, " # " );
            (*pPos) += 3;
            Dec_GraphPrint_rec( pFile, pGraph, pNode01, pNode01->fCompl1, pNamesIn, pPos, LitSizeMax );
            fprintf( pFile, ")" );
            (*pPos)++;
            return;
        }
    }
    if ( fCompl )
    {
        fprintf( pFile, "(" );
        (*pPos)++;
        Dec_GraphPrint_rec( pFile, pGraph, pNode0, !pNode->eEdge0.fCompl, pNamesIn, pPos, LitSizeMax );
        fprintf( pFile, " + " );
        (*pPos) += 3;
        Dec_GraphPrint_rec( pFile, pGraph, pNode1, !pNode->eEdge1.fCompl, pNamesIn, pPos, LitSizeMax );
        fprintf( pFile, ")" );
        (*pPos)++;
    }
    else
    {
        fprintf( pFile, "(" );
        (*pPos)++;
        Dec_GraphPrint_rec( pFile, pGraph, pNode0, pNode->eEdge0.fCompl, pNamesIn, pPos, LitSizeMax );
        Dec_GraphPrint_rec( pFile, pGraph, pNode1, pNode->eEdge1.fCompl, pNamesIn, pPos, LitSizeMax );
        fprintf( pFile, ")" );
        (*pPos)++;
    }
}